

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::ensure_alts(CVmObjGramProd *this,size_t cnt,size_t margin)

{
  vm_gram_ext *pvVar1;
  size_t __size;
  vmgram_alt_info **ppvVar2;
  long in_RDX;
  ulong in_RSI;
  CVmObjGramProd *in_RDI;
  size_t siz;
  
  pvVar1 = get_ext(in_RDI);
  if (pvVar1->alt_alo_ < in_RSI) {
    __size = (in_RDX + in_RSI) * 8;
    pvVar1 = get_ext(in_RDI);
    if (pvVar1->alts_ == (vmgram_alt_info **)0x0) {
      ppvVar2 = (vmgram_alt_info **)malloc(__size);
      pvVar1 = get_ext(in_RDI);
      pvVar1->alts_ = ppvVar2;
    }
    else {
      pvVar1 = get_ext(in_RDI);
      ppvVar2 = (vmgram_alt_info **)realloc(pvVar1->alts_,__size);
      pvVar1 = get_ext(in_RDI);
      pvVar1->alts_ = ppvVar2;
    }
    pvVar1 = get_ext(in_RDI);
    pvVar1->alt_alo_ = in_RDX + in_RSI;
  }
  return;
}

Assistant:

void CVmObjGramProd::ensure_alts(size_t cnt, size_t margin)
{
    /* if there's not room, allocate a bigger array */
    if (cnt > get_ext()->alt_alo_)
    {
        /* allocate or reallocate at the required size plus the margin */
        cnt += margin;
        size_t siz = cnt * sizeof(get_ext()->alts_[0]);
        if (get_ext()->alts_ != 0)
        {
            get_ext()->alts_ = (vmgram_alt_info **)t3realloc(
                get_ext()->alts_, siz);
        }
        else
        {
            get_ext()->alts_ = (vmgram_alt_info **)t3malloc(siz);
        }

        /* set the new allocated count */
        get_ext()->alt_alo_ = cnt;
    }
}